

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimePicker::setTimeRange(DateTimePicker *this,QTime *min,QTime *max)

{
  uint uVar1;
  ulong uVar2;
  DateTimePickerPrivate *pDVar3;
  QDate *pQVar4;
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  *this_00;
  QDateTime local_40 [12];
  uint local_34;
  QDate *local_30;
  QDateTime local_28 [8];
  QTime *local_20;
  QTime *max_local;
  QTime *min_local;
  DateTimePicker *this_local;
  
  local_20 = max;
  max_local = min;
  min_local = (QTime *)this;
  uVar2 = QTime::isValid();
  if (((uVar2 & 1) != 0) && (uVar2 = QTime::isValid(), (uVar2 & 1) != 0)) {
    this_00 = &this->d;
    QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
    ::operator->(this_00);
    local_30 = (QDate *)QDateTime::date();
    local_34 = max_local->mds;
    pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(this_00);
    QDateTime::QDateTime(local_28,local_30,(QTime *)(ulong)local_34,pDVar3->spec,0);
    QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
    ::operator->(this_00);
    pQVar4 = (QDate *)QDateTime::date();
    uVar1 = local_20->mds;
    pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    QDateTime::QDateTime(local_40,pQVar4,(QTime *)(ulong)uVar1,pDVar3->spec,0);
    setDateTimeRange(this,local_28,local_40);
    QDateTime::~QDateTime(local_40);
    QDateTime::~QDateTime(local_28);
  }
  return;
}

Assistant:

void
DateTimePicker::setTimeRange( const QTime & min, const QTime & max )
{
	if( min.isValid() && max.isValid() )
		setDateTimeRange( QDateTime( d->minimum.date(), min, d->spec ),
			QDateTime( d->maximum.date(), max, d->spec ) );
}